

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * mp_rshift_fixed(mp_int *x,size_t bits)

{
  mp_int *r;
  long lVar1;
  
  lVar1 = 0;
  if (bits >> 6 <= x->nw) {
    lVar1 = x->nw - (bits >> 6);
  }
  r = mp_make_sized(lVar1 + (ulong)(lVar1 == 0));
  mp_rshift_fixed_into(r,x,bits);
  return r;
}

Assistant:

mp_int *mp_rshift_fixed(mp_int *x, size_t bits)
{
    size_t words = bits / BIGNUM_INT_BITS;
    size_t nw = x->nw - size_t_min(x->nw, words);
    mp_int *r = mp_make_sized(size_t_max(nw, 1));
    mp_rshift_fixed_into(r, x, bits);
    return r;
}